

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O0

void __thiscall Diligent::VulkanUploadHeap::~VulkanUploadHeap(VulkanUploadHeap *this)

{
  undefined *puVar1;
  bool bVar2;
  Char *Message;
  undefined8 uVar3;
  char (*in_R8) [29];
  char **in_stack_ffffffffffffff50;
  char *local_90;
  MemorySizeFormatter<unsigned_long> local_88;
  MemorySizeFormatter<unsigned_long> local_70;
  undefined1 local_58 [8];
  string _msg;
  VkDeviceSize PeakAllocatedPages;
  string msg;
  VulkanUploadHeap *this_local;
  
  msg.field_2._8_8_ = this;
  bVar2 = std::
          vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
          ::empty(&this->m_Pages);
  if (!bVar2) {
    FormatString<char[14],std::__cxx11::string,char[29]>
              ((string *)&PeakAllocatedPages,(Diligent *)"Upload heap \'",
               (char (*) [14])&this->m_HeapName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' not all pages are released",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~VulkanUploadHeap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUploadHeap.cpp"
               ,0x30);
    std::__cxx11::string::~string((string *)&PeakAllocatedPages);
  }
  _msg.field_2._8_8_ = this->m_PeakAllocatedSize / this->m_PageSize;
  FormatMemorySize<unsigned_long>(&local_70,this->m_PeakFrameSize,2,this->m_PeakAllocatedSize);
  FormatMemorySize<unsigned_long>(&local_88,this->m_PeakAllocatedSize,2,0);
  local_90 = " pages)";
  if (_msg.field_2._8_8_ == 1) {
    local_90 = " page)";
  }
  FormatString<std::__cxx11::string,char[34],Diligent::MemorySizeFormatter<unsigned_long>,char[4],Diligent::MemorySizeFormatter<unsigned_long>,char[3],unsigned_long,char_const*>
            ((string *)local_58,(Diligent *)&this->m_HeapName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " peak used/allocated frame size: ",(char (*) [34])&local_70,
             (MemorySizeFormatter<unsigned_long> *)" / ",(char (*) [4])&local_88,
             (MemorySizeFormatter<unsigned_long> *)0xc1a302,(char (*) [3])((long)&_msg.field_2 + 8),
             (unsigned_long *)&local_90,in_stack_ffffffffffffff50);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar3,0);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::~vector(&this->m_Pages);
  std::__cxx11::string::~string((string *)&this->m_HeapName);
  return;
}

Assistant:

VulkanUploadHeap::~VulkanUploadHeap()
{
    DEV_CHECK_ERR(m_Pages.empty(), "Upload heap '", m_HeapName, "' not all pages are released");
    auto PeakAllocatedPages = m_PeakAllocatedSize / m_PageSize;
    LOG_INFO_MESSAGE(m_HeapName, " peak used/allocated frame size: ", FormatMemorySize(m_PeakFrameSize, 2, m_PeakAllocatedSize),
                     " / ", FormatMemorySize(m_PeakAllocatedSize, 2),
                     " (", PeakAllocatedPages, (PeakAllocatedPages == 1 ? " page)" : " pages)"));
}